

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CompareModeCase::iterate(CompareModeCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  anon_unknown_1 *this_01;
  bool bVar1;
  int iVar2;
  GLenum err;
  undefined4 extraout_var;
  MessageBuilder *result;
  char *description;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  TextureLevel stencilOnlyLevel;
  TextureLevel readLevel;
  TextureLevel uploadLevel;
  ConstPixelBufferAccess local_1c8;
  MessageBuilder local_1a0;
  Functions *gl;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&depthStencilTex,context);
  local_1a0.m_log = (TestLog *)glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel(&uploadLevel,(TextureFormat *)&local_1a0,0x40,0x40,1);
  local_1a0.m_log = (TestLog *)0x2100000008;
  tcu::TextureLevel::TextureLevel(&readLevel,(TextureFormat *)&local_1a0,0x40,0x40,1);
  local_1a0.m_log = (TestLog *)0x1e00000013;
  tcu::TextureLevel::TextureLevel(&stencilOnlyLevel,(TextureFormat *)&local_1a0,0x40,0x40,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "NOTE: Texture compare mode has no effect when reading stencil values.");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_1a0,&uploadLevel);
  renderTestPatternReference((PixelBufferAccess *)&local_1a0);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_1a0,&stencilOnlyLevel);
  renderTestPatternReference((PixelBufferAccess *)&local_1a0);
  (*gl->bindTexture)(0xde1,depthStencilTex.super_ObjectWrapper.m_object);
  (*gl->texStorage2D)(0xde1,1,this->m_format,0x40,0x40);
  (*gl->texParameteri)(0xde1,0x884c,0x884e);
  (*gl->texParameteri)(0xde1,0x884d,0x201);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&local_1a0,&uploadLevel);
  glu::texSubImage2D(context,0xde1,0,0,0,(ConstPixelBufferAccess *)&local_1a0);
  err = (*gl->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x38d);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8236,0x40,0x40);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(gl);
  blitStencilToColor2D(context,depthStencilTex.super_ObjectWrapper.m_object,0x40,0x40);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_1a0,&readLevel);
  result = &local_1a0;
  glu::readPixels(context,0,0,(PixelBufferAccess *)result);
  this_01 = (anon_unknown_1 *)
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&local_1a0,&stencilOnlyLevel);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_1c8,&readLevel);
  bVar1 = compareStencilToRed(this_01,(TestLog *)&local_1a0,&local_1c8,
                              (ConstPixelBufferAccess *)result);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel(&stencilOnlyLevel);
  tcu::TextureLevel::~TextureLevel(&readLevel);
  tcu::TextureLevel::~TextureLevel(&uploadLevel);
  glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 64;
		const int					height				= 64;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height);
		TextureLevel				readLevel			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				stencilOnlyLevel	(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		m_testCtx.getLog() << TestLog::Message << "NOTE: Texture compare mode has no effect when reading stencil values." << TestLog::EndMessage;

		renderTestPatternReference(uploadLevel);
		renderTestPatternReference(stencilOnlyLevel);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, GL_LESS);
		glu::texSubImage2D(renderCtx, GL_TEXTURE_2D, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, readLevel);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), stencilOnlyLevel, readLevel);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}